

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O0

void RescalerImportRowExpand_SSE2(WebPRescaler *wrk,uint8_t *src)

{
  int iVar1;
  undefined1 auVar2 [16];
  __m128i alVar3;
  uint8_t *in_RSI;
  WebPRescaler *in_RDI;
  undefined1 auVar4 [16];
  __m128i out_1;
  __m128i mult_1;
  uint8_t *src_limit;
  int left;
  __m128i out;
  __m128i mult;
  __m128i cur_pixels;
  int accum;
  int x_add;
  rescaler_t *frow_end;
  rescaler_t *frow;
  int local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  __m128i local_108;
  uint local_f8;
  uint local_f4;
  rescaler_t *local_f0;
  rescaler_t *local_e8;
  uint8_t *local_e0;
  WebPRescaler *local_d8;
  uint local_cc;
  ulong local_c8;
  undefined8 uStack_c0;
  longlong local_b8;
  longlong lStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  longlong local_98;
  longlong lStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  rescaler_t *local_70;
  undefined1 local_68 [16];
  uint local_4c;
  undefined8 local_48;
  uint8_t *puStack_40;
  undefined8 local_38;
  uint8_t *puStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  uint local_10;
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_e8 = in_RDI->frow;
  local_f0 = local_e8 + in_RDI->dst_width * in_RDI->num_channels;
  local_f8 = in_RDI->x_add;
  local_f4 = local_f8;
  if ((in_RDI->src_width < 8) || (0x7fff < (int)local_f8)) {
    WebPRescalerImportRowExpand_C(in_RDI,in_RSI);
  }
  else {
    local_e0 = in_RSI;
    local_d8 = in_RDI;
    if (in_RDI->num_channels == 4) {
      LoadTwoPixels_SSE2(in_RSI,&local_108);
      local_e0 = local_e0 + 4;
      while( true ) {
        local_cc = (local_f4 - local_f8) * 0x10000 | local_f8;
        local_a8 = CONCAT44(local_cc,local_cc);
        uStack_a0 = CONCAT44(local_cc,local_cc);
        local_98 = local_108[0];
        lStack_90 = local_108[1];
        auVar2._8_8_ = uStack_a0;
        auVar2._0_8_ = local_a8;
        auVar4 = pmaddwd((undefined1  [16])local_108,auVar2);
        local_128 = auVar4._0_8_;
        uStack_120 = auVar4._8_8_;
        local_70 = local_e8;
        local_88 = local_128;
        uStack_80 = uStack_120;
        *(undefined8 *)local_e8 = local_128;
        *(undefined8 *)(local_e8 + 2) = uStack_120;
        local_e8 = local_e8 + 4;
        if (local_f0 <= local_e8) break;
        local_f8 = local_f8 - local_d8->x_sub;
        if ((int)local_f8 < 0) {
          local_28 = local_a8;
          uStack_20 = uStack_a0;
          local_10 = local_cc;
          local_c = local_cc;
          local_8 = local_cc;
          local_4 = local_cc;
          LoadTwoPixels_SSE2(local_e0,&local_108);
          local_e0 = local_e0 + 4;
          local_f8 = local_f4 + local_f8;
        }
      }
    }
    else {
      iVar1 = in_RDI->src_width;
      LoadEightPixels_SSE2(in_RSI,&local_108);
      local_e0 = local_e0 + 7;
      local_12c = 7;
      while( true ) {
        local_4c = (local_f4 - local_f8) * 0x10000 | local_f8;
        local_68._4_4_ = 0;
        local_68._0_4_ = local_4c;
        local_b8 = local_108[0];
        lStack_b0 = local_108[1];
        local_c8 = local_68._0_8_;
        uStack_c0 = 0;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_68._0_8_;
        auVar4 = pmaddwd((undefined1  [16])local_108,auVar4);
        local_48 = auVar4._0_8_;
        puStack_40 = auVar4._8_8_;
        local_68 = ZEXT416(local_4c);
        local_38 = local_48;
        puStack_30 = puStack_40;
        WebPInt32ToMem(puStack_40,auVar4._4_4_);
        alVar3 = local_108;
        local_e8 = local_e8 + 1;
        if (local_f0 <= local_e8) break;
        local_f8 = local_f8 - local_d8->x_sub;
        if ((int)local_f8 < 0) {
          local_12c = local_12c + -1;
          if (local_12c == 0) {
            if (in_RSI + (long)iVar1 + -8 < local_e0) {
              local_108[0] = local_108._2_8_;
              local_108[1] = alVar3[1] >> 0x10;
              local_108[0] = local_108[0] & 0xffffffff0000ffffU | (ulong)local_e0[1] << 0x10;
              local_e0 = local_e0 + 1;
              local_12c = 1;
            }
            else {
              LoadEightPixels_SSE2(local_e0,&local_108);
              local_e0 = local_e0 + 7;
              local_12c = 7;
            }
          }
          else {
            local_108 = (__m128i)((undefined1  [16])local_108 >> 0x10);
          }
          local_f8 = local_f4 + local_f8;
        }
      }
    }
  }
  return;
}

Assistant:

static void RescalerImportRowExpand_SSE2(WebPRescaler* WEBP_RESTRICT const wrk,
                                         const uint8_t* WEBP_RESTRICT src) {
  rescaler_t* frow = wrk->frow;
  const rescaler_t* const frow_end = frow + wrk->dst_width * wrk->num_channels;
  const int x_add = wrk->x_add;
  int accum = x_add;
  __m128i cur_pixels;

  // SSE2 implementation only works with 16b signed arithmetic at max.
  if (wrk->src_width < 8 || accum >= (1 << 15)) {
    WebPRescalerImportRowExpand_C(wrk, src);
    return;
  }

  assert(!WebPRescalerInputDone(wrk));
  assert(wrk->x_expand);
  if (wrk->num_channels == 4) {
    LoadTwoPixels_SSE2(src, &cur_pixels);
    src += 4;
    while (1) {
      const __m128i mult = _mm_set1_epi32(((x_add - accum) << 16) | accum);
      const __m128i out = _mm_madd_epi16(cur_pixels, mult);
      _mm_storeu_si128((__m128i*)frow, out);
      frow += 4;
      if (frow >= frow_end) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        LoadTwoPixels_SSE2(src, &cur_pixels);
        src += 4;
        accum += x_add;
      }
    }
  } else {
    int left;
    const uint8_t* const src_limit = src + wrk->src_width - 8;
    LoadEightPixels_SSE2(src, &cur_pixels);
    src += 7;
    left = 7;
    while (1) {
      const __m128i mult = _mm_cvtsi32_si128(((x_add - accum) << 16) | accum);
      const __m128i out = _mm_madd_epi16(cur_pixels, mult);
      assert(sizeof(*frow) == sizeof(uint32_t));
      WebPInt32ToMem((uint8_t*)frow, _mm_cvtsi128_si32(out));
      frow += 1;
      if (frow >= frow_end) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        if (--left) {
          cur_pixels = _mm_srli_si128(cur_pixels, 2);
        } else if (src <= src_limit) {
          LoadEightPixels_SSE2(src, &cur_pixels);
          src += 7;
          left = 7;
        } else {   // tail
          cur_pixels = _mm_srli_si128(cur_pixels, 2);
          cur_pixels = _mm_insert_epi16(cur_pixels, src[1], 1);
          src += 1;
          left = 1;
        }
        accum += x_add;
      }
    }
  }
  assert(accum == 0);
}